

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sensitive.cc
# Opt level: O0

void COST_SENSITIVE::print_update
               (vw *all,bool is_test,example *ec,multi_ex *ec_seq,bool action_scores,
               uint32_t prediction)

{
  bool bVar1;
  _Setfill<char> _Var2;
  _Setw _Var3;
  ostream *this;
  undefined8 uVar4;
  substring *ss;
  action_score *paVar5;
  long in_RCX;
  long in_RDX;
  byte in_SIL;
  long *in_RDI;
  byte in_R8B;
  double dVar6;
  ostringstream pred_buf;
  string label_buf;
  example **ecc;
  iterator __end3;
  iterator __begin3;
  multi_ex *__range3;
  size_t num_current_features;
  undefined4 in_stack_fffffffffffffd48;
  uint32_t in_stack_fffffffffffffd4c;
  namedlabels *in_stack_fffffffffffffd50;
  substring *in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffda0;
  string local_240 [32];
  substring local_220;
  substring local_210;
  undefined4 in_stack_fffffffffffffe00;
  float progress_arg;
  undefined1 progress_add;
  _func_int **in_stack_fffffffffffffe08;
  string *in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe18;
  size_t in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe2f;
  shared_data *in_stack_fffffffffffffe30;
  float in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  size_t in_stack_ffffffffffffff48;
  uint32_t in_stack_ffffffffffffff54;
  string *in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff6f;
  shared_data *in_stack_ffffffffffffff70;
  string local_70 [32];
  reference local_50;
  example **local_48;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> local_40;
  long local_38;
  long local_30;
  byte local_21;
  long local_20;
  long local_18;
  byte local_9;
  long *local_8;
  
  local_9 = in_SIL & 1;
  local_21 = in_R8B & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  dVar6 = shared_data::weighted_examples((shared_data *)*in_RDI);
  if ((((double)*(float *)(*local_8 + 0x50) <= dVar6) &&
      ((*(byte *)((long)local_8 + 0x3439) & 1) == 0)) &&
     ((*(byte *)((long)local_8 + 0x9c) & 1) == 0)) {
    local_30 = *(long *)(local_18 + 0x68a0);
    if (local_20 != 0) {
      local_30 = 0;
      local_38 = local_20;
      local_40._M_current =
           (example **)
           std::vector<example_*,_std::allocator<example_*>_>::begin
                     ((vector<example_*,_std::allocator<example_*>_> *)
                      CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      local_48 = (example **)
                 std::vector<example_*,_std::allocator<example_*>_>::end
                           ((vector<example_*,_std::allocator<example_*>_> *)
                            CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                                 *)in_stack_fffffffffffffd50,
                                (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)),
            bVar1) {
        local_50 = __gnu_cxx::
                   __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                   ::operator*(&local_40);
        local_30 = (*local_50)->num_features + local_30;
        __gnu_cxx::
        __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
        operator++(&local_40);
      }
    }
    std::__cxx11::string::string(local_70);
    if ((local_9 & 1) == 0) {
      std::__cxx11::string::operator=(local_70," known");
    }
    else {
      std::__cxx11::string::operator=(local_70," unknown");
    }
    if (((local_21 & 1) == 0) && (*(long *)(*local_8 + 0x70) == 0)) {
      shared_data::print_update
                (in_stack_ffffffffffffff70,(bool)in_stack_ffffffffffffff6f,in_stack_ffffffffffffff60
                 ,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,in_stack_ffffffffffffff48,
                 (bool)in_stack_ffffffffffffff47,in_stack_ffffffffffffff40);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffe08);
      _Var3 = std::setw(8);
      this = std::operator<<((ostream *)&stack0xfffffffffffffe08,_Var3);
      progress_add = (undefined1)((uint)_Var3._M_n >> 0x18);
      uVar4 = std::ostream::operator<<(this,std::right);
      _Var2 = std::setfill<char>(' ');
      progress_arg = (float)CONCAT13(_Var2._M_c,(int3)in_stack_fffffffffffffe00);
      std::operator<<(uVar4,_Var2._M_c);
      if (*(long *)(*local_8 + 0x70) == 0) {
        paVar5 = v_array<ACTION_SCORE::action_score>::operator[]
                           ((v_array<ACTION_SCORE::action_score> *)(local_18 + 0x6850),0);
        std::ostream::operator<<(&stack0xfffffffffffffe08,paVar5->action);
      }
      else if ((local_21 & 1) == 0) {
        local_220 = namedlabels::get(in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
        ::operator<<((ostream *)CONCAT17(_Var2._M_c,in_stack_fffffffffffffda0),
                     in_stack_fffffffffffffd98);
      }
      else {
        ss = (substring *)
             v_array<ACTION_SCORE::action_score>::operator[]
                       ((v_array<ACTION_SCORE::action_score> *)(local_18 + 0x6850),0);
        local_210 = namedlabels::get(in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
        ::operator<<((ostream *)CONCAT17(_Var2._M_c,in_stack_fffffffffffffda0),ss);
      }
      if ((local_21 & 1) != 0) {
        std::operator<<((ostream *)&stack0xfffffffffffffe08,".....");
      }
      std::__cxx11::ostringstream::str();
      shared_data::print_update
                (in_stack_fffffffffffffe30,(bool)in_stack_fffffffffffffe2f,in_stack_fffffffffffffe20
                 ,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                 (size_t)in_stack_fffffffffffffe08,(bool)progress_add,progress_arg);
      std::__cxx11::string::~string(local_240);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xfffffffffffffe08);
    }
    std::__cxx11::string::~string(local_70);
  }
  return;
}

Assistant:

void print_update(vw& all, bool is_test, example& ec, multi_ex* ec_seq, bool action_scores, uint32_t prediction)
{
  if (all.sd->weighted_examples() >= all.sd->dump_interval && !all.quiet && !all.bfgs)
  {
    size_t num_current_features = ec.num_features;
    // for csoaa_ldf we want features from the whole (multiline example),
    // not only from one line (the first one) represented by ec
    if (ec_seq != nullptr)
    {
      num_current_features = 0;
      // TODO: including quadratic and cubic.
      for (auto & ecc : *ec_seq) num_current_features += ecc->num_features;
    }

    std::string label_buf;
    if (is_test)
      label_buf = " unknown";
    else
      label_buf = " known";

    if (action_scores || all.sd->ldict)
    {
      std::ostringstream pred_buf;

      pred_buf << std::setw(all.sd->col_current_predict) << std::right << std::setfill(' ');
      if (all.sd->ldict)
      {
        if (action_scores)
          pred_buf << all.sd->ldict->get(ec.pred.a_s[0].action);
        else
          pred_buf << all.sd->ldict->get(prediction);
      }
      else
        pred_buf << ec.pred.a_s[0].action;
      if (action_scores)
        pred_buf << ".....";
      all.sd->print_update(all.holdout_set_off, all.current_pass, label_buf, pred_buf.str(), num_current_features,
          all.progress_add, all.progress_arg);
      ;
    }
    else
      all.sd->print_update(all.holdout_set_off, all.current_pass, label_buf, prediction, num_current_features,
          all.progress_add, all.progress_arg);
  }
}